

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O0

void __thiscall
QStringTokenizerBase<QStringView,_QChar>::iterator::iterator
          (iterator *this,QStringTokenizerBase<QStringView,_QChar> *t)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  toFront(t);
  return;
}

Assistant:

explicit iterator(const QStringTokenizerBase &t) noexcept
            : tokenizer{&t}, current{t.toFront()} {}